

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O0

CcsDomain * __thiscall
ccs::CcsDomain::loadCcsStream
          (CcsDomain *this,istream *stream,string *fileName,ImportResolver *importResolver)

{
  element_type *this_00;
  CcsTracer *trace;
  type dag;
  Loader loader;
  ImportResolver *importResolver_local;
  string *fileName_local;
  istream *stream_local;
  CcsDomain *this_local;
  
  loader.trace = (CcsTracer *)importResolver;
  std::unique_ptr<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_>::operator->(&this->dag);
  DagBuilder::root((DagBuilder *)&stack0xffffffffffffffc0);
  this_00 = std::__shared_ptr_access<const_ccs::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<const_ccs::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&stack0xffffffffffffffc0);
  trace = Node::tracer(this_00);
  Loader::Loader((Loader *)&stack0xffffffffffffffd0,trace);
  std::shared_ptr<const_ccs::Node>::~shared_ptr
            ((shared_ptr<const_ccs::Node> *)&stack0xffffffffffffffc0);
  dag = std::unique_ptr<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_>::operator*
                  (&this->dag);
  Loader::loadCcsStream
            ((Loader *)&stack0xffffffffffffffd0,stream,fileName,dag,(ImportResolver *)loader.trace);
  return this;
}

Assistant:

CcsDomain &CcsDomain::loadCcsStream(std::istream &stream,
    const std::string &fileName, ImportResolver &importResolver) {
  Loader loader(dag->root()->tracer());
  loader.loadCcsStream(stream, fileName, *dag, importResolver);
  return *this;
}